

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_entry_retriever.cpp
# Opt level: O1

LogicalType * __thiscall
duckdb::CatalogEntryRetriever::GetType
          (LogicalType *__return_storage_ptr__,CatalogEntryRetriever *this,string *catalog,
          string *schema,string *name,OnEntryNotFound on_entry_not_found)

{
  optional_ptr<duckdb::CatalogEntry,_true> result_00;
  optional_ptr<duckdb::CatalogEntry,_true> result;
  EntryLookupInfo lookup_info;
  optional_ptr<duckdb::CatalogEntry,_true> local_58;
  EntryLookupInfo local_50;
  
  EntryLookupInfo::EntryLookupInfo(&local_50,TYPE_ENTRY,name,(QueryErrorContext)0xffffffffffffffff);
  result_00 = Catalog::GetEntry(this,catalog,schema,&local_50,on_entry_not_found);
  local_58 = ReturnAndCallback(this,result_00);
  if (local_58.ptr == (CatalogEntry *)0x0) {
    LogicalType::LogicalType(__return_storage_ptr__,INVALID);
  }
  else {
    optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_58);
    LogicalType::LogicalType(__return_storage_ptr__,(LogicalType *)&local_58.ptr[1].timestamp);
  }
  return __return_storage_ptr__;
}

Assistant:

LogicalType CatalogEntryRetriever::GetType(const string &catalog, const string &schema, const string &name,
                                           OnEntryNotFound on_entry_not_found) {
	EntryLookupInfo lookup_info(CatalogType::TYPE_ENTRY, name);
	auto result = GetEntry(catalog, schema, lookup_info, on_entry_not_found);
	if (!result) {
		return LogicalType::INVALID;
	}
	auto &type_entry = result->Cast<TypeCatalogEntry>();
	return type_entry.user_type;
}